

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O1

bool si9ma::SinglyLinkedList::is_palindroom2(SinglyNodeWithRand *head)

{
  SinglyNodeWithRand **ppSVar1;
  int *piVar2;
  SinglyNodeWithRand *pSVar3;
  bool bVar4;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  _Deque_base<int,_std::allocator<int>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_78,0);
  pSVar3 = head;
  if (head != (SinglyNodeWithRand *)0x0) {
    do {
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_78,&pSVar3->value);
      }
      else {
        *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar3->value;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      ppSVar1 = &pSVar3->next;
      pSVar3 = *ppSVar1;
    } while (*ppSVar1 != (SinglyNodeWithRand *)0x0);
  }
  bVar4 = head == (SinglyNodeWithRand *)0x0;
  while (!bVar4) {
    piVar2 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar2 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (head->value != piVar2[-1]) break;
    head = head->next;
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
      operator_delete(local_78._M_impl.super__Deque_impl_data._M_finish._M_first);
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
    }
    else {
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
    }
    bVar4 = head == (SinglyNodeWithRand *)0x0;
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_78);
  return bVar4;
}

Assistant:

bool SinglyLinkedList::is_palindroom2(si9ma::SinglyNodeWithRand *head) {
        auto *ptr = head;
        stack<int> s_stack;
        while (ptr != nullptr){
            s_stack.push(ptr->value);
            ptr = ptr->next;
        }

        ptr = head;
        while (ptr != nullptr){
            if (ptr->value != s_stack.top())
                return false;

            ptr = ptr->next;
            s_stack.pop();
        }

        return true;
    }